

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O1

void __thiscall ProjectWriter::writeJunctions(ProjectWriter *this)

{
  Node *pNVar1;
  long lVar2;
  long lVar3;
  pointer pcVar4;
  int iVar5;
  ostream *poVar6;
  pointer ppNVar7;
  Junction *junc;
  pointer ppNVar8;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  double local_48;
  pointer local_40;
  ostream *local_38;
  
  poVar6 = (ostream *)&this->field_0x18;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n[JUNCTIONS]\n",0xd);
  ppNVar7 = (this->network->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppNVar8 = (this->network->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_40 = ppNVar8;
  local_38 = poVar6;
  if (ppNVar7 != ppNVar8) {
    do {
      pNVar1 = *ppNVar7;
      iVar5 = (*(pNVar1->super_Element)._vptr_Element[2])(pNVar1);
      if (iVar5 == 0) {
        lVar2 = *(long *)&this->field_0x18;
        lVar3 = *(long *)(lVar2 + -0x18);
        *(uint *)(&this->field_0x30 + lVar3) =
             *(uint *)(&this->field_0x30 + lVar3) & 0xffffff4f | 0x20;
        *(undefined8 *)(&this->field_0x28 + *(long *)(lVar2 + -0x18)) = 0x10;
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,(pNVar1->super_Element).name._M_dataplus._M_p,
                            (pNVar1->super_Element).name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        lVar2 = *(long *)&this->field_0x18;
        *(undefined8 *)(&this->field_0x28 + *(long *)(lVar2 + -0x18)) = 0xc;
        *(uint *)(&this->field_0x30 + *(long *)(lVar2 + -0x18)) =
             *(uint *)(&this->field_0x30 + *(long *)(lVar2 + -0x18)) & 0xfffffefb | 4;
        *(undefined8 *)(&this->field_0x20 + *(long *)(lVar2 + -0x18)) = 4;
        std::ostream::_M_insert<double>(pNVar1->elev * (this->network->units).factors[1]);
        pcVar4 = (this->network->options).stringOptions[5]._M_dataplus._M_p;
        local_68[0] = local_58;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_68,pcVar4,
                   pcVar4 + (this->network->options).stringOptions[5]._M_string_length);
        iVar5 = std::__cxx11::string::compare((char *)local_68);
        if (local_68[0] != local_58) {
          operator_delete(local_68[0]);
        }
        poVar6 = local_38;
        if (iVar5 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(local_38,"*     *    ",0xb);
          lVar2 = *(long *)&this->field_0x18;
          local_48 = (this->network->units).factors[4];
          *(undefined8 *)(&this->field_0x28 + *(long *)(lVar2 + -0x18)) = 0xc;
          *(uint *)(&this->field_0x30 + *(long *)(lVar2 + -0x18)) =
               *(uint *)(&this->field_0x30 + *(long *)(lVar2 + -0x18)) & 0xfffffefb | 4;
          *(undefined8 *)(&this->field_0x20 + *(long *)(lVar2 + -0x18)) = 4;
          std::ostream::_M_insert<double>(pNVar1[1].elev * local_48);
          lVar2 = *(long *)&this->field_0x18;
          *(undefined8 *)(&this->field_0x28 + *(long *)(lVar2 + -0x18)) = 0xc;
          *(uint *)(&this->field_0x30 + *(long *)(lVar2 + -0x18)) =
               *(uint *)(&this->field_0x30 + *(long *)(lVar2 + -0x18)) & 0xfffffefb | 4;
          *(undefined8 *)(&this->field_0x20 + *(long *)(lVar2 + -0x18)) = 4;
          std::ostream::_M_insert<double>(local_48 * pNVar1[1].xCoord);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        ppNVar8 = local_40;
      }
      ppNVar7 = ppNVar7 + 1;
    } while (ppNVar7 != ppNVar8);
  }
  return;
}

Assistant:

void ProjectWriter::writeJunctions()
{
    fout << "\n[JUNCTIONS]\n";
    for (Node* node : network->nodes)
    {
        if ( node->type() == Node::JUNCTION )
        {
            Junction* junc = static_cast<Junction*>(node);
            fout << left << setw(16) << node->name << " ";
            fout << setw(12) << fixed << setprecision(4);
            fout << node->elev*network->ucf(Units::LENGTH);

            if (network->option(Options::DEMAND_MODEL) != "FIXED" )
            {
                fout << "*     *    "; //Blank fields for primary demand and pattern
                double pUcf = network->ucf(Units::PRESSURE);
                fout << setw(12) << fixed << setprecision(4);
                fout << junc->pMin * pUcf;
                fout << setw(12) << fixed << setprecision(4);
                fout << junc->pFull * pUcf;
            }
            fout <<  "\n";
        }
    }
}